

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

void h2_pri_spec(Curl_easy *data,nghttp2_priority_spec *pri_spec)

{
  undefined4 uVar1;
  int weight;
  Curl_data_priority *pCVar2;
  int32_t local_3c;
  int32_t *local_38;
  int32_t depstream_id;
  stream_ctx *depstream;
  Curl_data_priority *prio;
  nghttp2_priority_spec *pri_spec_local;
  Curl_easy *data_local;
  
  pCVar2 = &(data->set).priority;
  if ((pCVar2->parent == (Curl_easy *)0x0) || ((pCVar2->parent->req).p.file == (FILEPROTO *)0x0)) {
    local_38 = (int32_t *)0x0;
  }
  else {
    local_38 = (int32_t *)((pCVar2->parent->req).p.http)->h2_ctx;
  }
  if (local_38 == (int32_t *)0x0) {
    local_3c = 0;
  }
  else {
    local_3c = *local_38;
  }
  weight = sweight_wanted(data);
  nghttp2_priority_spec_init(pri_spec,local_3c,weight,(uint)((data->set).priority.field_0x14 & 1));
  (data->state).priority.parent = pCVar2->parent;
  (data->state).priority.children = (data->set).priority.children;
  uVar1 = *(undefined4 *)&(data->set).priority.field_0x14;
  (data->state).priority.weight = (data->set).priority.weight;
  *(undefined4 *)&(data->state).priority.field_0x14 = uVar1;
  return;
}

Assistant:

static void h2_pri_spec(struct Curl_easy *data,
                        nghttp2_priority_spec *pri_spec)
{
  struct Curl_data_priority *prio = &data->set.priority;
  struct stream_ctx *depstream = H2_STREAM_CTX(prio->parent);
  int32_t depstream_id = depstream? depstream->id:0;
  nghttp2_priority_spec_init(pri_spec, depstream_id,
                             sweight_wanted(data),
                             data->set.priority.exclusive);
  data->state.priority = *prio;
}